

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

string * __thiscall cmCTestBZR::LoadInfo_abi_cxx11_(string *__return_storage_ptr__,cmCTestBZR *this)

{
  pointer *ppbVar1;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined1 *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_958;
  string local_918;
  undefined1 local_8f8 [8];
  OutputLogger rerr;
  RevnoParser rout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  string local_610 [32];
  iterator local_5f0;
  size_type local_5e8;
  undefined1 local_5e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_revno;
  undefined1 local_5a8 [8];
  OutputLogger ierr;
  InfoParser iout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80 [32];
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_info;
  string bzr;
  cmCTestBZR *this_local;
  string *rev;
  
  ppbVar1 = &bzr_info.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string
            ((string *)ppbVar1,
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
  iout.RegexParent.progsize._2_1_ = 1;
  std::__cxx11::string::string((string *)&local_a0,(string *)ppbVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,"info",(allocator<char> *)((long)&iout.RegexParent.progsize + 3));
  iout.RegexParent.progsize._2_1_ = 0;
  local_60 = &local_a0;
  local_58 = 2;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&iout.RegexParent.progsize + 1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l_00._M_len = local_58;
  __l_00._M_array = local_60;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50,__l_00,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&iout.RegexParent.progsize + 1));
  local_958 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
  do {
    local_958 = local_958 + -1;
    std::__cxx11::string::~string((string *)local_958);
  } while (local_958 != &local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&iout.RegexParent.progsize + 3));
  InfoParser::InfoParser((InfoParser *)&ierr.super_LineParser.Separator,this,"info-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_5a8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "info-err> ");
  ppbVar1 = &bzr_revno.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)ppbVar1);
  cmCTestVC::RunChild((cmCTestVC *)this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_50,(OutputParser *)&ierr.super_LineParser.Separator,
                      (OutputParser *)local_5a8,(string *)ppbVar1,Auto);
  std::__cxx11::string::~string
            ((string *)
             &bzr_revno.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  rout.RegexRevno._558_1_ = 1;
  std::__cxx11::string::string
            ((string *)&local_630,
             (string *)
             &bzr_info.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_610,"revno",(allocator<char> *)&rout.RegexRevno.field_0x22f);
  rout.RegexRevno._558_1_ = 0;
  local_5f0 = &local_630;
  local_5e8 = 2;
  this_01 = &rout.RegexRevno.field_0x22d;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_01);
  __l._M_len = local_5e8;
  __l._M_array = local_5f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_5e0,__l,(allocator_type *)this_01);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&rout.RegexRevno.field_0x22d);
  local_990 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5f0;
  do {
    local_990 = local_990 + -1;
    std::__cxx11::string::~string((string *)local_990);
  } while (local_990 != &local_630);
  std::allocator<char>::~allocator((allocator<char> *)&rout.RegexRevno.field_0x22f);
  rout.RegexRevno._556_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  RevnoParser::RevnoParser
            ((RevnoParser *)&rerr.super_LineParser.Separator,this,"revno-out> ",
             __return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_8f8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "revno-err> ");
  std::__cxx11::string::string((string *)&local_918);
  cmCTestVC::RunChild((cmCTestVC *)this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_5e0,(OutputParser *)&rerr.super_LineParser.Separator,
                      (OutputParser *)local_8f8,&local_918,Auto);
  std::__cxx11::string::~string((string *)&local_918);
  rout.RegexRevno._556_1_ = 1;
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_8f8);
  RevnoParser::~RevnoParser((RevnoParser *)&rerr.super_LineParser.Separator);
  if ((rout.RegexRevno._556_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5e0);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_5a8);
  InfoParser::~InfoParser((InfoParser *)&ierr.super_LineParser.Separator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::__cxx11::string::~string
            ((string *)
             &bzr_info.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestBZR::LoadInfo()
{
  // Run "bzr info" to get the repository info from the work tree.
  std::string bzr = this->CommandLineTool;
  std::vector<std::string> bzr_info = { bzr, "info" };
  InfoParser iout(this, "info-out> ");
  OutputLogger ierr(this->Log, "info-err> ");
  this->RunChild(bzr_info, &iout, &ierr);

  // Run "bzr revno" to get the repository revision number from the work tree.
  std::vector<std::string> bzr_revno = { bzr, "revno" };
  std::string rev;
  RevnoParser rout(this, "revno-out> ", rev);
  OutputLogger rerr(this->Log, "revno-err> ");
  this->RunChild(bzr_revno, &rout, &rerr);

  return rev;
}